

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Snapshot.cpp
# Opt level: O0

RealType __thiscall OpenMD::Snapshot::getExcludedPotential(Snapshot *this)

{
  double *pdVar1;
  long in_RDI;
  int i;
  undefined4 local_c;
  
  if ((*(byte *)(in_RDI + 0xa77) & 1) == 0) {
    *(undefined8 *)(in_RDI + 0x760) = 0;
    for (local_c = 0; (int)local_c < 7; local_c = local_c + 1) {
      pdVar1 = Vector<double,_7U>::operator[]((Vector<double,_7U> *)(in_RDI + 0x768),local_c);
      *(double *)(in_RDI + 0x760) = *pdVar1 + *(double *)(in_RDI + 0x760);
    }
    *(undefined1 *)(in_RDI + 0xa77) = 1;
    *(undefined1 *)(in_RDI + 0xa79) = 0;
    *(undefined1 *)(in_RDI + 0xa70) = 0;
  }
  return *(RealType *)(in_RDI + 0x760);
}

Assistant:

RealType Snapshot::getExcludedPotential() {
    if (!hasExcludedPotential) {
      frameData.excludedPotential = 0.0;
      for (int i = 0; i < N_INTERACTION_FAMILIES; i++) {
        frameData.excludedPotential += frameData.excludedPotentials[i];
      }
      hasExcludedPotential = true;
      hasPotentialEnergy   = false;
      hasTotalEnergy       = false;
    }
    return frameData.excludedPotential;
  }